

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::CalculateDeltaStats
          (BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this)

{
  int64_t iVar1;
  hugeint_t b;
  hugeint_t a;
  hugeint_t a_00;
  bool bVar2;
  ulong uVar3;
  int64_t i;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uhugeint_t uVar7;
  hugeint_t hVar8;
  uint64_t in_stack_ffffffffffffffa8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  
  uVar9 = 0xffffffffffffffff;
  uVar10 = 0x7fffffffffffffff;
  uVar7 = hugeint_t::operator_cast_to_uhugeint_t((hugeint_t *)&stack0xffffffffffffffb0);
  uVar11 = uVar7.lower;
  bVar2 = uhugeint_t::operator>(&this->maximum,(uhugeint_t *)&stack0xffffffffffffffc0);
  if (bVar2) {
    return;
  }
  uVar3 = this->compression_buffer_idx;
  if (uVar3 < 2) {
    return;
  }
  if (this->all_valid != true) {
    return;
  }
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < (long)uVar3; lVar4 = lVar4 + 1) {
    hVar8 = uhugeint_t::operator_cast_to_hugeint_t
                      ((uhugeint_t *)((long)&this->compression_buffer->lower + lVar5));
    uVar11 = hVar8.lower;
    hVar8 = uhugeint_t::operator_cast_to_hugeint_t
                      ((uhugeint_t *)((long)&this->compression_buffer[-1].lower + lVar5));
    uVar9 = hVar8.lower;
    uVar10 = hVar8.upper;
    hVar8 = hugeint_t::operator-
                      ((hugeint_t *)&stack0xffffffffffffffc0,(hugeint_t *)&stack0xffffffffffffffb0);
    *(uint64_t *)((long)&this->delta_buffer[0].lower + lVar5) = hVar8.lower;
    *(int64_t *)((long)&this->delta_buffer[0].upper + lVar5) = hVar8.upper;
    uVar3 = this->compression_buffer_idx;
    lVar5 = lVar5 + 0x10;
  }
  this->can_do_delta = true;
  for (uVar6 = 1; uVar6 < uVar3; uVar6 = uVar6 + 1) {
    a.upper = uVar11;
    a.lower = uVar10;
    hVar8.upper = uVar9;
    hVar8.lower = in_stack_ffffffffffffffa8;
    hVar8 = MaxValue<duckdb::hugeint_t>(a,hVar8);
    this->maximum_delta = hVar8;
    a_00.upper = uVar11;
    a_00.lower = uVar10;
    b.upper = uVar9;
    b.lower = in_stack_ffffffffffffffa8;
    hVar8 = MinValue<duckdb::hugeint_t>(a_00,b);
    this->minimum_delta = hVar8;
    uVar3 = this->compression_buffer_idx;
  }
  iVar1 = (this->minimum_delta).upper;
  this->delta_buffer[0].lower = (this->minimum_delta).lower;
  this->delta_buffer[0].upper = iVar1;
  if (this->can_do_delta != false) {
    bVar2 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                      (this->maximum_delta,this->minimum_delta,&this->min_max_delta_diff);
    this->can_do_delta = bVar2;
    if (bVar2) {
      hVar8 = uhugeint_t::operator_cast_to_hugeint_t(this->compression_buffer);
      bVar2 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                        (hVar8,this->minimum_delta,&this->delta_offset);
      goto LAB_014f9a4b;
    }
  }
  bVar2 = false;
LAB_014f9a4b:
  this->can_do_delta = bVar2;
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}